

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-gguf.cpp
# Opt level: O0

bool all_kv_in_other(gguf_context *ctx,gguf_context *other)

{
  bool bVar1;
  gguf_type gVar2;
  gguf_type gVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  undefined8 in_RSI;
  undefined8 in_RDI;
  char *data_other;
  char *data;
  string str_other_1;
  string str_1;
  int8_t *data_other_1;
  int8_t *data_1;
  string str_other;
  string str;
  size_t arr_i_1;
  size_t arr_i;
  int8_t *data_other_2;
  int8_t *data_2;
  gguf_type type_arr;
  size_t arr_n;
  gguf_type type;
  int idx_other;
  char *name;
  int id;
  int n_kv;
  bool ok;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  allocator<char> *in_stack_fffffffffffffe80;
  allocator<char> *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  allocator<char> local_119;
  string local_118 [39];
  allocator<char> local_f1;
  string local_f0 [32];
  undefined8 local_d0;
  allocator<char> *local_c8;
  allocator<char> local_b9;
  string local_b8 [55];
  allocator<char> local_81;
  string local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  long local_50;
  long local_48;
  gguf_type local_3c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  gguf_type local_30;
  int local_2c;
  undefined8 local_28;
  int local_1c;
  int local_18;
  byte local_11;
  undefined8 local_10;
  undefined8 local_8;
  
  local_11 = 1;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = gguf_get_n_kv(in_RDI);
  for (local_1c = 0; local_1c < local_18; local_1c = local_1c + 1) {
    local_28 = gguf_get_key(local_8,(long)local_1c);
    local_2c = gguf_find_key(local_10,local_28);
    if (local_2c < 0) {
      local_11 = 0;
    }
    else {
      gVar2 = gguf_get_kv_type(local_8,(long)local_1c);
      local_30 = gVar2;
      gVar3 = gguf_get_kv_type(local_10,(long)local_2c);
      if (gVar2 == gVar3) {
        if (local_30 == GGUF_TYPE_ARRAY) {
          pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gguf_get_arr_n(local_8,(long)local_1c);
          local_38 = pbVar4;
          pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gguf_get_arr_n(local_10,(long)local_2c);
          if (pbVar4 == pbVar5) {
            gVar2 = gguf_get_arr_type(local_8,(long)local_1c);
            local_3c = gVar2;
            gVar3 = gguf_get_arr_type(local_10,(long)local_2c);
            if (gVar2 == gVar3) {
              if (local_3c == GGUF_TYPE_BOOL) {
                local_48 = gguf_get_arr_data(local_8,(long)local_1c);
                local_50 = gguf_get_arr_data(local_10,(long)local_2c);
                for (local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0; local_58 < local_38;
                    local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_58->field_0x1) {
                  if (((&local_58->_M_dataplus)[local_48] != (_Alloc_hider)0x0) !=
                      ((&local_58->_M_dataplus)[local_50] != (_Alloc_hider)0x0)) {
                    local_11 = 0;
                  }
                }
              }
              else if (local_3c == GGUF_TYPE_STRING) {
                for (local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0; local_60 < local_38;
                    local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_60->field_0x1) {
                  gguf_get_arr_str(local_8,(long)local_1c,local_60);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88,
                             in_stack_fffffffffffffe80);
                  std::allocator<char>::~allocator(&local_81);
                  gguf_get_arr_str(local_10,(long)local_2c,local_60);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88,
                             in_stack_fffffffffffffe80);
                  std::allocator<char>::~allocator(&local_b9);
                  bVar1 = std::operator!=(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
                  if (bVar1) {
                    local_11 = 0;
                  }
                  std::__cxx11::string::~string(local_b8);
                  std::__cxx11::string::~string(local_80);
                }
              }
              else {
                local_c8 = (allocator<char> *)gguf_get_arr_data(local_8,(long)local_1c);
                local_d0 = gguf_get_arr_data(local_10,(long)local_2c);
                in_stack_fffffffffffffe80 = local_c8;
                in_stack_fffffffffffffe88 = local_c8;
                in_stack_fffffffffffffe90 = local_38;
                gguf_type_size(local_3c);
                bVar1 = std::equal<signed_char_const*,signed_char_const*>
                                  ((char *)in_stack_fffffffffffffe50,
                                   (char *)in_stack_fffffffffffffe48,(char *)0x111804);
                if (!bVar1) {
                  local_11 = 0;
                }
              }
            }
            else {
              local_11 = 0;
            }
          }
          else {
            local_11 = 0;
          }
        }
        else if (local_30 == GGUF_TYPE_STRING) {
          gguf_get_val_str(local_8,(long)local_1c);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88,
                     in_stack_fffffffffffffe80);
          std::allocator<char>::~allocator(&local_f1);
          gguf_get_val_str(local_10,(long)local_2c);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88,
                     in_stack_fffffffffffffe80);
          std::allocator<char>::~allocator(&local_119);
          bVar1 = std::operator!=(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
          if (bVar1) {
            local_11 = 0;
          }
          std::__cxx11::string::~string(local_118);
          std::__cxx11::string::~string(local_f0);
        }
        else {
          in_stack_fffffffffffffe50 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               gguf_get_val_data(local_8,(long)local_1c);
          gguf_get_val_data(local_10,(long)local_2c);
          gguf_type_size(local_30);
          bVar1 = std::equal<char_const*,char_const*>
                            ((char *)in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48,
                             (char *)0x1119f8);
          if (!bVar1) {
            local_11 = 0;
          }
        }
      }
      else {
        local_11 = 0;
      }
    }
  }
  return (bool)(local_11 & 1);
}

Assistant:

static bool all_kv_in_other(const gguf_context * ctx, const gguf_context * other) {
    bool ok = true;

    const int n_kv = gguf_get_n_kv(ctx);
    for (int id = 0; id < n_kv; ++id) {
        const char * name = gguf_get_key(ctx, id);

        const int idx_other = gguf_find_key(other, name);
        if (idx_other < 0) {
            ok = false;
            continue;
        }

        const gguf_type type = gguf_get_kv_type(ctx, id);
        if (type != gguf_get_kv_type(other, idx_other)) {
            ok = false;
            continue;
        }

        if (type == GGUF_TYPE_ARRAY) {
            const size_t arr_n = gguf_get_arr_n(ctx, id);
            if (arr_n != gguf_get_arr_n(other, idx_other)) {
                ok = false;
                continue;
            }

            const gguf_type type_arr = gguf_get_arr_type(ctx, id);
            if (type_arr != gguf_get_arr_type(other, idx_other)) {
                ok = false;
                continue;
            }

            if (type_arr == GGUF_TYPE_BOOL) {
                const int8_t * data       = reinterpret_cast<const int8_t *>(gguf_get_arr_data(ctx,   id));
                const int8_t * data_other = reinterpret_cast<const int8_t *>(gguf_get_arr_data(other, idx_other));
                for (size_t arr_i = 0; arr_i < arr_n; ++arr_i) {
                    if (bool(data[arr_i]) != bool(data_other[arr_i])) {
                        ok = false;
                    }
                }
                continue;
            }

            if (type_arr == GGUF_TYPE_STRING) {
                for (size_t arr_i = 0; arr_i < arr_n; ++arr_i) {
                    const std::string str       = gguf_get_arr_str(ctx,   id,       arr_i);
                    const std::string str_other = gguf_get_arr_str(other, idx_other, arr_i);
                    if (str != str_other) {
                        ok = false;
                    }
                }
                continue;
            }

            const int8_t * data       = reinterpret_cast<const int8_t *>(gguf_get_arr_data(ctx,   id));
            const int8_t * data_other = reinterpret_cast<const int8_t *>(gguf_get_arr_data(other, idx_other));
            if (!std::equal(data, data + arr_n*gguf_type_size(type_arr), data_other)) {
                ok = false;
            }
            continue;
        }

        if (type == GGUF_TYPE_STRING) {
            const std::string str       = gguf_get_val_str(ctx,   id);
            const std::string str_other = gguf_get_val_str(other, idx_other);
            if (str != str_other) {
                ok = false;
            }
            continue;
        }

        const char * data       = reinterpret_cast<const char *>(gguf_get_val_data(ctx,   id));
        const char * data_other = reinterpret_cast<const char *>(gguf_get_val_data(other, idx_other));
        if (!std::equal(data, data + gguf_type_size(type), data_other)) {
            ok = false;
        }
    }

    return ok;
}